

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  string *psVar1;
  size_type *psVar2;
  size_type *psVar3;
  undefined8 uVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  string *psVar9;
  ostream *poVar10;
  long *plVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  undefined8 extraout_RAX;
  size_type *psVar16;
  long *plVar17;
  string *psVar18;
  _Alloc_hider _Var19;
  int iVar20;
  undefined1 local_1020 [8];
  ToolOptions options;
  ofstream dst;
  long local_ea8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_ea0 [14];
  ios_base local_dc0 [592];
  undefined1 local_b70 [8];
  ProgramResult result;
  size_type **local_9e8;
  undefined8 uStack_9e0;
  code *local_9d8;
  code *pcStack_9d0;
  string *local_9c8;
  undefined8 uStack_9c0;
  code *local_9b8;
  code *pcStack_9b0;
  bool *local_9a8;
  undefined8 uStack_9a0;
  code *local_998;
  code *pcStack_990;
  bool *local_988;
  undefined8 uStack_980;
  code *local_978;
  code *pcStack_970;
  bool *local_968;
  undefined8 uStack_960;
  code *local_958;
  code *pcStack_950;
  bool *local_948;
  undefined8 uStack_940;
  code *local_938;
  code *pcStack_930;
  bool *local_928;
  undefined8 uStack_920;
  code *local_918;
  code *pcStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  code *local_8f8;
  code *local_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  code *local_8d8;
  code *local_8d0;
  size_type **local_8c8;
  undefined8 uStack_8c0;
  code *local_8b8;
  code *pcStack_8b0;
  long *local_8a0 [2];
  long local_890 [2];
  long *local_880 [2];
  long local_870 [2];
  long *local_860 [2];
  long local_850 [2];
  long *local_840 [2];
  long local_830 [2];
  long *local_820 [2];
  long local_810 [2];
  long *local_800 [2];
  long local_7f0 [2];
  string local_7e0;
  string local_7c0;
  string local_7a0;
  long *local_780 [2];
  long local_770 [2];
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  long *local_6c0 [2];
  long local_6b0 [2];
  long *local_6a0 [2];
  long local_690 [2];
  long *local_680 [2];
  long local_670 [2];
  long *local_660 [2];
  long local_650 [2];
  long *local_640 [2];
  long local_630 [2];
  long *local_620 [2];
  long local_610 [2];
  char *local_600;
  string binDir;
  long local_5d0 [2];
  long *local_5c0 [2];
  long local_5b0 [2];
  long *local_5a0 [2];
  long local_590 [2];
  long *local_580 [2];
  long local_570 [2];
  long *local_560 [2];
  long local_550 [2];
  long *local_540 [2];
  long local_530 [2];
  long *local_520 [2];
  long local_510 [2];
  long *local_500 [2];
  long local_4f0 [2];
  long *local_4e0 [2];
  long local_4d0 [2];
  long *local_4c0 [2];
  long local_4b0 [2];
  long *local_4a0 [2];
  long local_490 [2];
  long *local_480 [2];
  long local_470 [2];
  long *local_460 [2];
  long local_450 [2];
  long *local_440 [2];
  long local_430 [2];
  long *local_420 [2];
  long local_410 [2];
  long *local_400 [2];
  long local_3f0 [2];
  long *local_3e0 [2];
  long local_3d0 [2];
  long *local_3c0 [2];
  long local_3b0 [2];
  long *local_3a0 [2];
  long local_390 [2];
  long *local_380 [2];
  long local_370 [2];
  long *local_360 [2];
  long local_350 [2];
  long *local_340 [2];
  long local_330 [2];
  long *local_320 [2];
  long local_310 [2];
  string local_300;
  string *local_2e0;
  ModuleWriter writer;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  string local_258;
  long *local_238 [2];
  long local_228 [2];
  long *local_218 [2];
  long local_208 [2];
  long *local_1f8 [2];
  long local_1e8 [2];
  code **local_1d8;
  undefined8 uStack_1d0;
  code *local_1c8;
  code *pcStack_1c0;
  undefined1 auStack_1b8 [8];
  ProgramResult resultOnInvalid;
  anon_class_8_1_a7eb7a0b local_180;
  anon_class_8_1_a7eb7a0b stopIfNotForced;
  long local_170 [2];
  size_type *local_160;
  string input;
  ProgramResult resultOnValid;
  string WasmReduceOption;
  string command;
  string test;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  size_type *local_90;
  string working;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  ulong local_48;
  char **local_40;
  bool local_35;
  bool local_34;
  bool local_33;
  bool local_32;
  bool local_31 [4];
  bool deNan;
  bool verbose;
  bool debugInfo;
  bool force;
  bool binary;
  
  local_160 = &input._M_string_length;
  input._M_dataplus._M_p = (pointer)0x0;
  input._M_string_length._0_1_ = 0;
  command.field_2._8_8_ = &test._M_string_length;
  test._M_dataplus._M_p = (pointer)0x0;
  test._M_string_length._0_1_ = 0;
  local_90 = &working._M_string_length;
  working._M_dataplus._M_p = (pointer)0x0;
  working._M_string_length._0_1_ = 0;
  WasmReduceOption.field_2._8_8_ = &command._M_string_length;
  command._M_dataplus._M_p = (pointer)0x0;
  command._M_string_length._0_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options.enabledFeatures,*argv,(allocator<char> *)local_b70);
  wasm::Path::getDirName((string *)&local_600);
  if ((long *)options._352_8_ != &local_ea8) {
    operator_delete((void *)options._352_8_,local_ea8 + 1);
  }
  local_31[0] = true;
  local_35 = false;
  local_34 = false;
  local_33 = false;
  local_32 = false;
  resultOnValid.time = (double)&WasmReduceOption._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&resultOnValid.time,"wasm-reduce options","");
  options._352_8_ = &local_ea8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&options.enabledFeatures,"wasm-reduce","");
  psVar1 = &result.output;
  local_b70 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b70,
             "Reduce a wasm file to a smaller one that has the same behavior on a given command","")
  ;
  wasm::ToolOptions::ToolOptions
            ((ToolOptions *)local_1020,(string *)&options.enabledFeatures,(string *)local_b70);
  if (local_b70 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_b70,(ulong)(result.output._M_dataplus._M_p + 1));
  }
  if ((long *)options._352_8_ != &local_ea8) {
    operator_delete((void *)options._352_8_,local_ea8 + 1);
  }
  options._352_8_ = &local_ea8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"--command","")
  ;
  local_b70 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b70,"-cmd","");
  local_48 = CONCAT44(local_48._4_4_,argc);
  local_2e0 = &writer.symbolMap;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e0,
             "The command to run on the test, that we want to reduce while keeping the command\'s output identical. We look at the command\'s return code and stdout here (TODO: stderr), and we reduce while keeping those unchanged."
             ,"");
  resultOnInvalid.code = 0;
  resultOnInvalid._4_4_ = 0;
  auStack_1b8 = (undefined1  [8])((long)&WasmReduceOption.field_2 + 8);
  resultOnInvalid.output._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1207:10)>
       ::_M_invoke;
  resultOnInvalid.output._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1207:10)>
                ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add((string *)local_1020,(string *)&options.enabledFeatures,
                              (string *)local_b70,(string *)&local_2e0,(int)&resultOnValid + 0x28,
                              (function *)0x1,SUB81(auStack_1b8,0));
  input.field_2._8_8_ = &resultOnValid.output;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&input.field_2 + 8),"--test","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"-t","");
  test.field_2._8_8_ = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&test.field_2 + 8),
             "Test file (this will be written to to test, the given command should read it when we call it)"
             ,"");
  uStack_1d0 = 0;
  local_1d8 = (code **)((long)&command.field_2 + 8);
  pcStack_1c0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1214:10)>
                ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1214:10)>
              ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)(input.field_2._M_local_buf + 8),(string *)&local_68,
                              (string *)(test.field_2._M_local_buf + 8),(int)&resultOnValid + 0x28,
                              (function *)0x1,SUB81(&local_1d8,0));
  local_180.force = (bool *)local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"--working","");
  binDir.field_2._8_8_ = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&binDir.field_2 + 8),"-w","");
  local_5c0[0] = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5c0,
             "Working file (this will contain the current good state while doing temporary computations, and will contain the final best result at the end)"
             ,"");
  uStack_9e0 = 0;
  local_9e8 = &local_90;
  pcStack_9d0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1222:10)>
                ::_M_invoke;
  local_9d8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1222:10)>
              ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)&local_180,
                              (string *)(binDir.field_2._M_local_buf + 8),(string *)local_5c0,
                              (int)&resultOnValid + 0x28,(function *)0x1,SUB81(&local_9e8,0));
  local_5a0[0] = local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"--binaries","");
  local_580[0] = local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"-b","");
  local_560[0] = local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_560,"binaryen binaries location (bin/ directory)","");
  uStack_9c0 = 0;
  pcStack_9b0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1228:10)>
                ::_M_invoke;
  local_9b8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1228:10)>
              ::_M_manager;
  local_9c8 = (string *)&local_600;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)local_5a0,(string *)local_580,(string *)local_560,
                              (int)&resultOnValid + 0x28,(function *)0x1,SUB81(&local_9c8,0));
  local_540[0] = local_530;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"--text","");
  local_520[0] = local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"-S","");
  local_500[0] = local_4f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_500,
             "Emit intermediate files as text, instead of binary (also make sure the test and working files have a .wat or .wast suffix)"
             ,"");
  uStack_9a0 = 0;
  local_9a8 = local_31;
  pcStack_990 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1238:10)>
                ::_M_invoke;
  local_998 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1238:10)>
              ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)local_540,(string *)local_520,(string *)local_500,
                              (int)&resultOnValid + 0x28,(function *)0x0,SUB81(&local_9a8,0));
  local_4e0[0] = local_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"--denan","");
  local_4c0[0] = local_4b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"");
  local_4a0[0] = local_490;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"Avoid nans when reducing","")
  ;
  uStack_980 = 0;
  local_988 = &local_35;
  pcStack_970 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1244:10)>
                ::_M_invoke;
  local_978 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1244:10)>
              ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)local_4e0,(string *)local_4c0,(string *)local_4a0,
                              (int)&resultOnValid + 0x28,(function *)0x0,SUB81(&local_988,0));
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"--verbose","");
  local_460[0] = local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"-v","");
  local_440[0] = local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"Verbose output mode","");
  uStack_960 = 0;
  local_968 = &local_34;
  pcStack_950 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1250:10)>
                ::_M_invoke;
  local_958 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1250:10)>
              ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)local_480,(string *)local_460,(string *)local_440,
                              (int)&resultOnValid + 0x28,(function *)0x0,SUB81(&local_968,0));
  local_420[0] = local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"--debugInfo","");
  local_400[0] = local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"-g","");
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3e0,"Keep debug info in binaries","");
  uStack_940 = 0;
  local_948 = &local_33;
  pcStack_930 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1256:10)>
                ::_M_invoke;
  local_938 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1256:10)>
              ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)local_420,(string *)local_400,(string *)local_3e0,
                              (int)&resultOnValid + 0x28,(function *)0x0,SUB81(&local_948,0));
  local_3c0[0] = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"--force","");
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"-f","");
  local_380[0] = local_370;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_380,
             "Force the reduction attempt, ignoring problems that imply it is unlikely to succeed",
             "");
  uStack_920 = 0;
  local_928 = &local_32;
  pcStack_910 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1263:10)>
                ::_M_invoke;
  local_918 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1263:10)>
              ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)local_3c0,(string *)local_3a0,(string *)local_380,
                              (int)&resultOnValid + 0x28,(function *)0x0,SUB81(&local_928,0));
  local_360[0] = local_350;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"--timeout","");
  local_8a0[0] = local_890;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8a0,"-to","");
  local_340[0] = local_330;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_340,
             "A timeout to apply to each execution of the command, in seconds (default: 2)","");
  local_908 = 0;
  uStack_900 = 0;
  local_8f0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1270:10)>
              ::_M_invoke;
  local_8f8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1270:10)>
              ::_M_manager;
  local_40 = argv;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)local_360,(string *)local_8a0,(string *)local_340,
                              (int)&resultOnValid + 0x28,(function *)0x1,SUB81(&local_908,0));
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"--extra-flags","");
  local_880[0] = local_870;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_880,"-ef","");
  local_860[0] = local_850;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_860,
             "Extra commandline flags to pass to wasm-opt while reducing. (default: --enable-all)",
             "");
  local_8e8 = 0;
  uStack_8e0 = 0;
  local_8d0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1280:10)>
              ::_M_invoke;
  local_8d8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1280:10)>
              ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)local_320,(string *)local_880,(string *)local_860,
                              (int)&resultOnValid + 0x28,(function *)0x1,SUB81(&local_8e8,0));
  local_840[0] = local_830;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"INFILE","");
  uStack_8c0 = 0;
  local_8c8 = &local_160;
  pcStack_8b0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1287:7)>
                ::_M_invoke;
  local_8b8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1287:7)>
              ::_M_manager;
  wasm::Options::add_positional(psVar9,(Arguments)local_840,(function *)0x1);
  if (local_8b8 != (code *)0x0) {
    (*local_8b8)(&local_8c8,&local_8c8,3);
  }
  if (local_840[0] != local_830) {
    operator_delete(local_840[0],local_830[0] + 1);
  }
  if (local_8d8 != (code *)0x0) {
    (*local_8d8)(&local_8e8,&local_8e8,3);
  }
  if (local_860[0] != local_850) {
    operator_delete(local_860[0],local_850[0] + 1);
  }
  if (local_880[0] != local_870) {
    operator_delete(local_880[0],local_870[0] + 1);
  }
  if (local_320[0] != local_310) {
    operator_delete(local_320[0],local_310[0] + 1);
  }
  psVar1 = &writer.symbolMap;
  if (local_8f8 != (code *)0x0) {
    (*local_8f8)(&local_908,&local_908,3);
  }
  if (local_340[0] != local_330) {
    operator_delete(local_340[0],local_330[0] + 1);
  }
  if (local_8a0[0] != local_890) {
    operator_delete(local_8a0[0],local_890[0] + 1);
  }
  if (local_360[0] != local_350) {
    operator_delete(local_360[0],local_350[0] + 1);
  }
  if (local_918 != (code *)0x0) {
    (*local_918)(&local_928,&local_928,3);
  }
  if (local_380[0] != local_370) {
    operator_delete(local_380[0],local_370[0] + 1);
  }
  if (local_3a0[0] != local_390) {
    operator_delete(local_3a0[0],local_390[0] + 1);
  }
  if (local_3c0[0] != local_3b0) {
    operator_delete(local_3c0[0],local_3b0[0] + 1);
  }
  if (local_938 != (code *)0x0) {
    (*local_938)(&local_948,&local_948,3);
  }
  if (local_3e0[0] != local_3d0) {
    operator_delete(local_3e0[0],local_3d0[0] + 1);
  }
  if (local_400[0] != local_3f0) {
    operator_delete(local_400[0],local_3f0[0] + 1);
  }
  if (local_420[0] != local_410) {
    operator_delete(local_420[0],local_410[0] + 1);
  }
  if (local_958 != (code *)0x0) {
    (*local_958)(&local_968,&local_968,3);
  }
  if (local_440[0] != local_430) {
    operator_delete(local_440[0],local_430[0] + 1);
  }
  if (local_460[0] != local_450) {
    operator_delete(local_460[0],local_450[0] + 1);
  }
  if (local_480[0] != local_470) {
    operator_delete(local_480[0],local_470[0] + 1);
  }
  if (local_978 != (code *)0x0) {
    (*local_978)(&local_988,&local_988,3);
  }
  if (local_4a0[0] != local_490) {
    operator_delete(local_4a0[0],local_490[0] + 1);
  }
  if (local_4c0[0] != local_4b0) {
    operator_delete(local_4c0[0],local_4b0[0] + 1);
  }
  if (local_4e0[0] != local_4d0) {
    operator_delete(local_4e0[0],local_4d0[0] + 1);
  }
  if (local_998 != (code *)0x0) {
    (*local_998)(&local_9a8,&local_9a8,3);
  }
  if (local_500[0] != local_4f0) {
    operator_delete(local_500[0],local_4f0[0] + 1);
  }
  if (local_520[0] != local_510) {
    operator_delete(local_520[0],local_510[0] + 1);
  }
  if (local_540[0] != local_530) {
    operator_delete(local_540[0],local_530[0] + 1);
  }
  if (local_9b8 != (code *)0x0) {
    (*local_9b8)(&local_9c8,&local_9c8,3);
  }
  if (local_560[0] != local_550) {
    operator_delete(local_560[0],local_550[0] + 1);
  }
  if (local_580[0] != local_570) {
    operator_delete(local_580[0],local_570[0] + 1);
  }
  if (local_5a0[0] != local_590) {
    operator_delete(local_5a0[0],local_590[0] + 1);
  }
  if (local_9d8 != (code *)0x0) {
    (*local_9d8)(&local_9e8,&local_9e8,3);
  }
  if (local_5c0[0] != local_5b0) {
    operator_delete(local_5c0[0],local_5b0[0] + 1);
  }
  if ((long *)binDir.field_2._8_8_ != local_5d0) {
    operator_delete((void *)binDir.field_2._8_8_,local_5d0[0] + 1);
  }
  if (local_180.force != (bool *)local_170) {
    operator_delete(local_180.force,local_170[0] + 1);
  }
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test.field_2._8_8_ != &local_a0) {
    operator_delete((void *)test.field_2._8_8_,local_a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((string *)input.field_2._8_8_ != &resultOnValid.output) {
    operator_delete((void *)input.field_2._8_8_,(ulong)(resultOnValid.output._M_dataplus._M_p + 1));
  }
  if (resultOnInvalid.output._M_dataplus._M_p != (pointer)0x0) {
    (*(code *)resultOnInvalid.output._M_dataplus._M_p)(auStack_1b8,auStack_1b8,3);
  }
  if (local_2e0 != psVar1) {
    operator_delete(local_2e0,(ulong)(writer.symbolMap._M_dataplus._M_p + 1));
  }
  if (local_b70 != (undefined1  [8])&result.output) {
    operator_delete((void *)local_b70,(ulong)(result.output._M_dataplus._M_p + 1));
  }
  if ((long *)options._352_8_ != &local_ea8) {
    operator_delete((void *)options._352_8_,local_ea8 + 1);
  }
  wasm::Options::parse((int)local_1020,(char **)(local_48 & 0xffffffff));
  if (local_33 == true) {
    std::__cxx11::string::append((char *)&extraFlags_abi_cxx11_);
  }
  iVar7 = wasm::getTypeSystem();
  if ((iVar7 != 1) && (iVar7 = wasm::getTypeSystem(), iVar7 != 0)) {
    wasm::handle_unreachable
              ("unexpected type system",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp"
               ,0x512);
  }
  std::__cxx11::string::append((char *)&extraFlags_abi_cxx11_);
  if (test._M_dataplus._M_p == (pointer)0x0) {
    wasm::Fatal::Fatal((Fatal *)&options.enabledFeatures);
    wasm::Fatal::operator<<
              ((Fatal *)&options.enabledFeatures,(char (*) [24])"test file not provided\n");
LAB_00113254:
    wasm::Fatal::~Fatal((Fatal *)&options.enabledFeatures);
  }
  if (working._M_dataplus._M_p == (pointer)0x0) {
    wasm::Fatal::Fatal((Fatal *)&options.enabledFeatures);
    wasm::Fatal::operator<<
              ((Fatal *)&options.enabledFeatures,(char (*) [27])"working file not provided\n");
    goto LAB_00113254;
  }
  if (local_31[0] == false) {
    Colors::setEnabled(false);
  }
  wasm::Path::setBinaryenBinDir((string *)&local_600);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|wasm-reduce\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|input: ",8);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(char *)local_160,(long)input._M_dataplus._M_p);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|test: ",7);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(char *)command.field_2._8_8_,
                       (long)test._M_dataplus._M_p);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|working: ",10);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(char *)local_90,(long)working._M_dataplus._M_p);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|bin dir: ",10);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,local_600,(long)binDir._M_dataplus._M_p);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|extra flags: ",0xe);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,extraFlags_abi_cxx11_._M_dataplus._M_p,
                       extraFlags_abi_cxx11_._M_string_length);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&options.enabledFeatures,1);
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_820,local_160,input._M_dataplus._M_p + (long)local_160);
  local_800[0] = local_7f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_800,command.field_2._8_8_,test._M_dataplus._M_p + command.field_2._8_8_
            );
  wasm::copy_file(local_820,local_800);
  if (local_800[0] != local_7f0) {
    operator_delete(local_800[0],local_7f0[0] + 1);
  }
  if (local_820[0] != local_810) {
    operator_delete(local_820[0],local_810[0] + 1);
  }
  local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7e0,WasmReduceOption.field_2._8_8_,
             command._M_dataplus._M_p + WasmReduceOption.field_2._8_8_);
  ProgramResult::getFromExecution(&expected,&local_7e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
    operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"|expected result:\n",0x12);
  ProgramResult::dump(&expected,(ostream *)&std::cerr);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"|!! Make sure the above is what you expect! !!\n\n",0x30);
  local_180.force = &local_32;
  if (((double)CONCAT44(0x45300000,(int)(timeout >> 0x20)) - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)timeout) - 4503599627370496.0) <= expected.time + 1.0) {
    local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_7c0,
               "execution time is dangerously close to the timeout - you should probably increase the timeout"
               ,"");
    main::anon_class_8_1_a7eb7a0b::operator()(&local_180,&local_7c0,&expected);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
      operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_32 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "|checking that command has different behavior on different inputs (this verifies that the test file is used by the command)\n"
               ,0x7c);
    std::ofstream::ofstream
              (&options.enabledFeatures,(string *)(command.field_2._M_local_buf + 8),_S_bin);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&options.enabledFeatures,"waka waka\n",10);
    options.enabledFeatures.features = _VTT;
    options.disabledFeatures.features = std::ofstream::VTT_4;
    *(undefined8 *)((long)&options.enabledFeatures.features + *(long *)(_VTT + -0x18)) = _finalize;
    std::filebuf::~filebuf((filebuf *)&dst);
    std::ios_base::~ios_base(local_dc0);
    local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7a0,WasmReduceOption.field_2._8_8_,
               command._M_dataplus._M_p + WasmReduceOption.field_2._8_8_);
    ProgramResult::ProgramResult((ProgramResult *)auStack_1b8,&local_7a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
      operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
    }
    bVar6 = ProgramResult::operator==((ProgramResult *)auStack_1b8,&expected);
    if (bVar6) {
      wasm::Module::Module((Module *)&options.enabledFeatures);
      psVar16 = &writer.symbolMap._M_string_length;
      uVar12 = (ulong)local_2e0 >> 0x10;
      writer.symbolMap._M_dataplus._M_p = (pointer)0x0;
      writer.symbolMap._M_string_length = writer.symbolMap._M_string_length & 0xffffffffffffff00;
      psVar2 = &writer.sourceMapFilename._M_string_length;
      writer.sourceMapFilename._M_dataplus._M_p = (pointer)0x0;
      writer.sourceMapFilename._M_string_length._0_1_ = 0;
      psVar3 = &writer.sourceMapUrl._M_string_length;
      writer.sourceMapUrl._M_dataplus._M_p = (pointer)0x0;
      writer.sourceMapUrl._M_string_length._0_1_ = 0;
      local_2e0 = (string *)CONCAT62((uint6)uVar12 & 0xffffffffff00,0x100);
      local_780[0] = local_770;
      writer._0_8_ = psVar16;
      writer.symbolMap.field_2._8_8_ = psVar2;
      writer.sourceMapFilename.field_2._8_8_ = psVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_780,command.field_2._8_8_,
                 test._M_dataplus._M_p + command.field_2._8_8_);
      wasm::ModuleWriter::write(&local_2e0,&options.enabledFeatures,local_780);
      if (local_780[0] != local_770) {
        operator_delete(local_780[0],local_770[0] + 1);
      }
      local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_760,WasmReduceOption.field_2._8_8_,
                 command._M_dataplus._M_p + WasmReduceOption.field_2._8_8_);
      ProgramResult::ProgramResult((ProgramResult *)((long)&input.field_2 + 8),&local_760);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_760._M_dataplus._M_p != &local_760.field_2) {
        operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
      }
      bVar6 = ProgramResult::operator==((ProgramResult *)((long)&input.field_2 + 8),&expected);
      if (bVar6) {
        wasm::Fatal::Fatal((Fatal *)local_b70);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&test.field_2 + 8),
                       "running the command on the given input gives the same result as when running it on either a trivial valid wasm or a file with nonsense in it. does the script not look at the test file ("
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&command.field_2 + 8));
        plVar11 = (long *)std::__cxx11::string::append(test.field_2._M_local_buf + 8);
        local_68._M_dataplus._M_p = (pointer)*plVar11;
        psVar16 = (size_type *)(plVar11 + 2);
        if ((size_type *)local_68._M_dataplus._M_p == psVar16) {
          local_68.field_2._M_allocated_capacity = *psVar16;
          local_68.field_2._8_8_ = plVar11[3];
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        }
        else {
          local_68.field_2._M_allocated_capacity = *psVar16;
        }
        local_68._M_string_length = plVar11[1];
        *plVar11 = (long)psVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        wasm::Fatal::operator<<((Fatal *)local_b70,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)(test.field_2._M_local_buf + 8));
        wasm::Fatal::~Fatal((Fatal *)local_b70);
      }
      if ((size_type *)resultOnValid._0_8_ != &resultOnValid.output._M_string_length) {
        operator_delete((void *)resultOnValid._0_8_,resultOnValid.output._M_string_length + 1);
      }
      if ((size_type *)writer.sourceMapFilename.field_2._8_8_ != psVar3) {
        operator_delete((void *)writer.sourceMapFilename.field_2._8_8_,
                        CONCAT71(writer.sourceMapUrl._M_string_length._1_7_,
                                 (undefined1)writer.sourceMapUrl._M_string_length) + 1);
      }
      if ((size_type *)writer.symbolMap.field_2._8_8_ != psVar2) {
        operator_delete((void *)writer.symbolMap.field_2._8_8_,
                        CONCAT71(writer.sourceMapFilename._M_string_length._1_7_,
                                 (undefined1)writer.sourceMapFilename._M_string_length) + 1);
      }
      if ((size_type *)writer._0_8_ != psVar16) {
        operator_delete((void *)writer._0_8_,writer.symbolMap._M_string_length + 1);
      }
      wasm::Module::~Module((Module *)&options.enabledFeatures);
    }
    if ((size_type *)resultOnInvalid._0_8_ != &resultOnInvalid.output._M_string_length) {
      operator_delete((void *)resultOnInvalid._0_8_,resultOnInvalid.output._M_string_length + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "|checking that command has expected behavior on canonicalized (read-written) binary\n"
             ,0x54);
  local_1d8 = &local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"wasm-opt","");
  wasm::Path::getBinaryenBinaryTool((string *)(test.field_2._M_local_buf + 8));
  plVar11 = (long *)std::__cxx11::string::append(test.field_2._M_local_buf + 8);
  psVar16 = (size_type *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar16) {
    local_68.field_2._M_allocated_capacity = *psVar16;
    local_68.field_2._8_8_ = plVar11[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar16;
    local_68._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_68._M_string_length = plVar11[1];
  *plVar11 = (long)psVar16;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_160);
  input.field_2._8_8_ = &resultOnValid.output;
  plVar17 = plVar11 + 2;
  if ((long *)*plVar11 == plVar17) {
    resultOnValid.output._M_dataplus._M_p = (pointer)*plVar17;
    resultOnValid.output._M_string_length = plVar11[3];
  }
  else {
    resultOnValid.output._M_dataplus._M_p = (pointer)*plVar17;
    input.field_2._8_8_ = (long *)*plVar11;
  }
  resultOnValid._0_8_ = plVar11[1];
  *plVar11 = (long)plVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append(input.field_2._M_local_buf + 8);
  plVar17 = plVar11 + 2;
  if ((string *)*plVar11 == (string *)plVar17) {
    resultOnInvalid.output._M_dataplus._M_p = (pointer)*plVar17;
    resultOnInvalid.output._M_string_length = plVar11[3];
    auStack_1b8 = (undefined1  [8])&resultOnInvalid.output;
  }
  else {
    resultOnInvalid.output._M_dataplus._M_p = (pointer)*plVar17;
    auStack_1b8 = (undefined1  [8])*plVar11;
  }
  resultOnInvalid._0_8_ = plVar11[1];
  *plVar11 = (long)plVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::_M_append(auStack_1b8,command.field_2._8_8_);
  local_b70 = (undefined1  [8])&result.output;
  plVar17 = plVar11 + 2;
  if ((string *)*plVar11 == (string *)plVar17) {
    result.output._M_dataplus._M_p = (pointer)*plVar17;
    result.output._M_string_length = plVar11[3];
  }
  else {
    result.output._M_dataplus._M_p = (pointer)*plVar17;
    local_b70 = (undefined1  [8])*plVar11;
  }
  result._0_8_ = plVar11[1];
  *plVar11 = (long)plVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append(local_b70);
  plVar17 = plVar11 + 2;
  if ((long *)*plVar11 == plVar17) {
    local_ea8 = *plVar17;
    aaStack_ea0[0]._0_8_ = plVar11[3];
    options._352_8_ = &local_ea8;
  }
  else {
    local_ea8 = *plVar17;
    options._352_8_ = (long *)*plVar11;
  }
  _dst = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)plVar11[1];
  *plVar11 = (long)plVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::_M_append
                              ((char *)&options.enabledFeatures,
                               (ulong)extraFlags_abi_cxx11_._M_dataplus._M_p);
  psVar18 = (string *)(plVar11 + 2);
  if ((string *)*plVar11 == psVar18) {
    writer.symbolMap._M_dataplus._M_p = (psVar18->_M_dataplus)._M_p;
    writer.symbolMap._M_string_length = plVar11[3];
    local_2e0 = psVar1;
  }
  else {
    writer.symbolMap._M_dataplus._M_p = (psVar18->_M_dataplus)._M_p;
    local_2e0 = (string *)*plVar11;
  }
  writer._0_8_ = plVar11[1];
  *plVar11 = (long)psVar18;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  if ((long *)options._352_8_ != &local_ea8) {
    operator_delete((void *)options._352_8_,local_ea8 + 1);
  }
  if (local_b70 != (undefined1  [8])&result.output) {
    operator_delete((void *)local_b70,(ulong)(result.output._M_dataplus._M_p + 1));
  }
  if (auStack_1b8 != (undefined1  [8])&resultOnInvalid.output) {
    operator_delete((void *)auStack_1b8,(ulong)(resultOnInvalid.output._M_dataplus._M_p + 1));
  }
  if ((string *)input.field_2._8_8_ != &resultOnValid.output) {
    operator_delete((void *)input.field_2._8_8_,(ulong)(resultOnValid.output._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test.field_2._8_8_ != &local_a0) {
    operator_delete((void *)test.field_2._8_8_,local_a0._M_allocated_capacity + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,(ulong)(local_1c8 + 1));
  }
  if (local_31[0] == false) {
    std::__cxx11::string::append((char *)&local_2e0);
  }
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_740,local_2e0,
             (undefined1 *)((long)&(local_2e0->_M_dataplus)._M_p + writer._0_8_));
  ProgramResult::ProgramResult((ProgramResult *)&options.enabledFeatures,&local_740);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
  }
  if (options.enabledFeatures.features == 0) {
    local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_700,WasmReduceOption.field_2._8_8_,
               command._M_dataplus._M_p + WasmReduceOption.field_2._8_8_);
    ProgramResult::ProgramResult((ProgramResult *)local_b70,&local_700);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_700._M_dataplus._M_p != &local_700.field_2) {
      operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
    }
    bVar6 = ProgramResult::operator==((ProgramResult *)local_b70,&expected);
    if (!bVar6) {
      local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6e0,
                 "running command on the canonicalized module should give the same results","");
      main::anon_class_8_1_a7eb7a0b::operator()(&local_180,&local_6e0,(ProgramResult *)local_b70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
        operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
      }
    }
    local_720.field_2._M_allocated_capacity = result.output._M_string_length;
    _Var19._M_p = (pointer)result._0_8_;
    if ((size_type *)result._0_8_ == &result.output._M_string_length) goto LAB_0011274c;
  }
  else {
    local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_720,"failed to read and write the binary","");
    main::anon_class_8_1_a7eb7a0b::operator()
              (&local_180,&local_720,(ProgramResult *)&options.enabledFeatures);
    _Var19._M_p = local_720._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_720._M_dataplus._M_p == &local_720.field_2) goto LAB_0011274c;
  }
  operator_delete(_Var19._M_p,local_720.field_2._M_allocated_capacity + 1);
LAB_0011274c:
  if (_dst != aaStack_ea0) {
    operator_delete(_dst,aaStack_ea0[0]._0_8_ + 1);
  }
  if (local_2e0 != psVar1) {
    operator_delete(local_2e0,(ulong)(writer.symbolMap._M_dataplus._M_p + 1));
  }
  local_6c0[0] = local_6b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_6c0,local_160,input._M_dataplus._M_p + (long)local_160);
  local_6a0[0] = local_690;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_6a0,local_90,working._M_dataplus._M_p + (long)local_90);
  wasm::copy_file(local_6c0,local_6a0);
  if (local_6a0[0] != local_690) {
    operator_delete(local_6a0[0],local_690[0] + 1);
  }
  if (local_6c0[0] != local_6b0) {
    operator_delete(local_6c0[0],local_6b0[0] + 1);
  }
  local_680[0] = local_670;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_680,local_90,working._M_dataplus._M_p + (long)local_90);
  uVar12 = wasm::file_size(local_680);
  if (local_680[0] != local_670) {
    operator_delete(local_680[0],local_670[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|input size: ",0xd);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"|starting reduction!\n",0x15);
  if (local_31[0] == true) {
    uVar12 = uVar12 * 2;
  }
  else {
    uVar12 = uVar12 / 10;
  }
  working.field_2._8_8_ = 0;
  uVar14 = 0;
  sVar15 = 0;
  do {
    writer.sourceMapUrl.field_2._8_8_ = &local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&writer.sourceMapUrl.field_2 + 8),WasmReduceOption.field_2._8_8_,
               command._M_dataplus._M_p + WasmReduceOption.field_2._8_8_);
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    local_48 = uVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,command.field_2._8_8_,
               test._M_dataplus._M_p + command.field_2._8_8_);
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_300,local_90,working._M_dataplus._M_p + (long)local_90);
    Reducer::Reducer((Reducer *)&options.enabledFeatures,
                     (string *)((long)&writer.sourceMapUrl.field_2 + 8),&local_258,&local_300,
                     local_31[0],local_35,local_34,local_33,(ToolOptions *)local_1020);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)writer.sourceMapUrl.field_2._8_8_ != &local_268) {
      operator_delete((void *)writer.sourceMapUrl.field_2._8_8_,local_268._M_allocated_capacity + 1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"|  reduce using passes...\n",0x1a);
    local_238[0] = local_228;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_238,local_90,working._M_dataplus._M_p + (long)local_90);
    lVar13 = wasm::file_size(local_238);
    if (local_238[0] != local_228) {
      operator_delete(local_238[0],local_228[0] + 1);
    }
    Reducer::reduceUsingPasses((Reducer *)&options.enabledFeatures);
    local_218[0] = local_208;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_218,local_90,working._M_dataplus._M_p + (long)local_90);
    uVar14 = wasm::file_size((string *)local_218);
    if (local_218[0] != local_208) {
      operator_delete(local_218[0],local_208[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"|  after pass reduction: ",0x19);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    if ((local_48 & 1) == 0) {
      if (working.field_2._8_8_ - 1 < uVar14) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"|  progress has stopped, skipping to the end\n",0x2d);
        local_40 = (char **)CONCAT71(local_40._1_7_,1);
        iVar7 = (int)uVar12;
        if (iVar7 != 1) {
          uVar12 = (ulong)(uint)((iVar7 - (iVar7 + 1 >> 0x1f)) + 1 >> 1);
          goto LAB_00112b89;
        }
      }
      else {
LAB_00112b89:
        local_40 = (char **)CONCAT71(local_40._1_7_,(char)local_48);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"|  pass progress: ",0x12);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", last destructive: ",0x14);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      local_b70[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_b70,1);
      iVar7 = (int)uVar12;
      if (lVar13 - uVar14 < sVar15 << 2) {
        if (iVar7 < 0xb) {
          uVar8 = (iVar7 - (iVar7 + 1 >> 0x1f)) + 1 >> 1;
        }
        else {
          uVar8 = (int)((uVar12 & 0xffffffff) / 3) + 1;
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"|  progress is good, do not quickly decrease factor\n",
                   0x34);
        uVar8 = (iVar7 * 9) / 10;
        if ((int)uVar8 < 2) {
          uVar8 = 1;
        }
      }
      if (uVar14 < 5) {
        __assert_fail("newSize > 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp"
                      ,0x5b4,"int main(int, const char **)");
      }
      iVar7 = (int)uVar14;
      iVar20 = iVar7 + 3;
      if (-1 < iVar7) {
        iVar20 = iVar7;
      }
      uVar12 = (ulong)(uint)(iVar20 >> 2);
      if ((int)uVar8 <= iVar20 >> 2) {
        uVar12 = (ulong)uVar8;
      }
      while( true ) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"|  reduce destructively... (factor: ",0x24);
        iVar7 = (int)uVar12;
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,")\n",2);
        sVar15 = Reducer::reduceDestructively((Reducer *)&options.enabledFeatures,iVar7);
        if (sVar15 != 0) break;
        if (iVar7 == 1) {
          local_40 = (char **)CONCAT71(local_40._1_7_,1);
          break;
        }
        iVar20 = iVar7 + 3;
        if (-1 < iVar7) {
          iVar20 = iVar7;
        }
        uVar8 = iVar20 >> 2;
        if ((int)uVar8 < 2) {
          uVar8 = 1;
        }
        uVar12 = (ulong)uVar8;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"|  destructive reduction led to size: ",0x26);
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f8,local_90,working._M_dataplus._M_p + (long)local_90);
      wasm::file_size(local_1f8);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      local_b70[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_b70,1);
      working.field_2._8_8_ = uVar14;
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
    }
    else {
      local_40 = (char **)CONCAT71(local_40._1_7_,(char)local_48);
    }
    uVar5 = local_48;
    uVar4 = working.field_2._8_8_;
    Reducer::~Reducer((Reducer *)&options.enabledFeatures);
    uVar14 = CONCAT71((int7)((ulong)extraout_RAX >> 8),local_40._0_1_) & 0xffffffff;
    working.field_2._8_8_ = uVar4;
    if ((uVar5 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"|finished, final size: ",0x17);
      local_660[0] = local_650;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_660,local_90,working._M_dataplus._M_p + (long)local_90);
      wasm::file_size(local_660);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      if (local_660[0] != local_650) {
        operator_delete(local_660[0],local_650[0] + 1);
      }
      local_640[0] = local_630;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_640,local_90,working._M_dataplus._M_p + (long)local_90);
      local_620[0] = local_610;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_620,command.field_2._8_8_,
                 test._M_dataplus._M_p + command.field_2._8_8_);
      wasm::copy_file(local_640,local_620);
      if (local_620[0] != local_610) {
        operator_delete(local_620[0],local_610[0] + 1);
      }
      if (local_640[0] != local_630) {
        operator_delete(local_640[0],local_630[0] + 1);
      }
      if (options.passOptions.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   options.passOptions.funcEffectsMap.
                   super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&options.passOptions.arguments._M_h._M_single_bucket);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&options.passOptions.ignoreImplicitTraps);
      wasm::Options::~Options((Options *)local_1020);
      if ((size_type *)resultOnValid.time != &WasmReduceOption._M_string_length) {
        operator_delete((void *)resultOnValid.time,WasmReduceOption._M_string_length + 1);
      }
      if ((size_type *)local_600 != &binDir._M_string_length) {
        operator_delete(local_600,binDir._M_string_length + 1);
      }
      if ((size_type *)WasmReduceOption.field_2._8_8_ != &command._M_string_length) {
        operator_delete((void *)WasmReduceOption.field_2._8_8_,
                        CONCAT71(command._M_string_length._1_7_,(undefined1)command._M_string_length
                                ) + 1);
      }
      if (local_90 != &working._M_string_length) {
        operator_delete(local_90,CONCAT71(working._M_string_length._1_7_,
                                          (undefined1)working._M_string_length) + 1);
      }
      if ((size_type *)command.field_2._8_8_ != &test._M_string_length) {
        operator_delete((void *)command.field_2._8_8_,
                        CONCAT71(test._M_string_length._1_7_,(undefined1)test._M_string_length) + 1)
        ;
      }
      if (local_160 != &input._M_string_length) {
        operator_delete(local_160,
                        CONCAT71(input._M_string_length._1_7_,(undefined1)input._M_string_length) +
                        1);
      }
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, const char* argv[]) {
  std::string input, test, working, command;
  // By default, look for binaries alongside our own binary.
  std::string binDir = Path::getDirName(argv[0]);
  bool binary = true, deNan = false, verbose = false, debugInfo = false,
       force = false;

  const std::string WasmReduceOption = "wasm-reduce options";

  ToolOptions options("wasm-reduce",
                      "Reduce a wasm file to a smaller one that has the same "
                      "behavior on a given command");
  options
    .add("--command",
         "-cmd",
         "The command to run on the test, that we want to reduce while keeping "
         "the command's output identical. "
         "We look at the command's return code and stdout here (TODO: stderr), "
         "and we reduce while keeping those unchanged.",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { command = argument; })
    .add("--test",
         "-t",
         "Test file (this will be written to to test, the given command should "
         "read it when we call it)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { test = argument; })
    .add("--working",
         "-w",
         "Working file (this will contain the current good state while doing "
         "temporary computations, "
         "and will contain the final best result at the end)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { working = argument; })
    .add("--binaries",
         "-b",
         "binaryen binaries location (bin/ directory)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           // Add separator just in case
           binDir = argument + Path::getPathSeparator();
         })
    .add("--text",
         "-S",
         "Emit intermediate files as text, instead of binary (also make sure "
         "the test and working files have a .wat or .wast suffix)",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { binary = false; })
    .add("--denan",
         "",
         "Avoid nans when reducing",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { deNan = true; })
    .add("--verbose",
         "-v",
         "Verbose output mode",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { verbose = true; })
    .add("--debugInfo",
         "-g",
         "Keep debug info in binaries",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { debugInfo = true; })
    .add("--force",
         "-f",
         "Force the reduction attempt, ignoring problems that imply it is "
         "unlikely to succeed",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { force = true; })
    .add("--timeout",
         "-to",
         "A timeout to apply to each execution of the command, in seconds "
         "(default: 2)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           timeout = atoi(argument.c_str());
           std::cout << "|applying timeout: " << timeout << "\n";
         })
    .add("--extra-flags",
         "-ef",
         "Extra commandline flags to pass to wasm-opt while reducing. "
         "(default: --enable-all)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           extraFlags = argument;
           std::cout << "|applying extraFlags: " << extraFlags << "\n";
         })
    .add_positional(
      "INFILE",
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { input = argument; });
  options.parse(argc, argv);

  if (debugInfo) {
    extraFlags += " -g ";
  }
  if (getTypeSystem() == TypeSystem::Nominal) {
    extraFlags += " --nominal";
  } else if (getTypeSystem() == TypeSystem::Isorecursive) {
    extraFlags += " --hybrid";
  } else {
    WASM_UNREACHABLE("unexpected type system");
  }

  if (test.size() == 0) {
    Fatal() << "test file not provided\n";
  }
  if (working.size() == 0) {
    Fatal() << "working file not provided\n";
  }

  if (!binary) {
    Colors::setEnabled(false);
  }

  Path::setBinaryenBinDir(binDir);

  std::cerr << "|wasm-reduce\n";
  std::cerr << "|input: " << input << '\n';
  std::cerr << "|test: " << test << '\n';
  std::cerr << "|working: " << working << '\n';
  std::cerr << "|bin dir: " << binDir << '\n';
  std::cerr << "|extra flags: " << extraFlags << '\n';

  // get the expected output
  copy_file(input, test);
  expected.getFromExecution(command);

  std::cerr << "|expected result:\n" << expected << '\n';
  std::cerr << "|!! Make sure the above is what you expect! !!\n\n";

  auto stopIfNotForced = [&](std::string message, ProgramResult& result) {
    std::cerr << "|! " << message << '\n' << result << '\n';
    if (!force) {
      Fatal() << "|! stopping, as it is very unlikely reduction can succeed "
                 "(use -f to ignore this check)";
    }
  };

  if (expected.time + 1 >= timeout) {
    stopIfNotForced("execution time is dangerously close to the timeout - you "
                    "should probably increase the timeout",
                    expected);
  }

  if (!force) {
    std::cerr << "|checking that command has different behavior on different "
                 "inputs (this "
                 "verifies that the test file is used by the command)\n";
    // Try it on an invalid input.
    {
      std::ofstream dst(test, std::ios::binary);
      dst << "waka waka\n";
    }
    ProgramResult resultOnInvalid(command);
    if (resultOnInvalid == expected) {
      // Try it on a valid input.
      Module emptyModule;
      ModuleWriter writer;
      writer.setBinary(true);
      writer.write(emptyModule, test);
      ProgramResult resultOnValid(command);
      if (resultOnValid == expected) {
        Fatal()
          << "running the command on the given input gives the same result as "
             "when running it on either a trivial valid wasm or a file with "
             "nonsense in it. does the script not look at the test file (" +
               test + ")? (use -f to ignore this check)";
      }
    }
  }

  std::cerr << "|checking that command has expected behavior on canonicalized "
               "(read-written) binary\n";
  {
    // read and write it
    auto cmd = Path::getBinaryenBinaryTool("wasm-opt") + " " + input + " -o " +
               test + " " + extraFlags;
    if (!binary) {
      cmd += " -S ";
    }
    ProgramResult readWrite(cmd);
    if (readWrite.failed()) {
      stopIfNotForced("failed to read and write the binary", readWrite);
    } else {
      ProgramResult result(command);
      if (result != expected) {
        stopIfNotForced("running command on the canonicalized module should "
                        "give the same results",
                        result);
      }
    }
  }

  copy_file(input, working);
  auto workingSize = file_size(working);
  std::cerr << "|input size: " << workingSize << "\n";

  std::cerr << "|starting reduction!\n";

  int factor = binary ? workingSize * 2 : workingSize / 10;

  size_t lastDestructiveReductions = 0;
  size_t lastPostPassesSize = 0;

  bool stopping = false;

  while (1) {
    Reducer reducer(
      command, test, working, binary, deNan, verbose, debugInfo, options);

    // run binaryen optimization passes to reduce. passes are fast to run
    // and can often reduce large amounts of code efficiently, as opposed
    // to detructive reduction (i.e., that doesn't preserve correctness as
    // passes do) since destrucive must operate one change at a time
    std::cerr << "|  reduce using passes...\n";
    auto oldSize = file_size(working);
    reducer.reduceUsingPasses();
    auto newSize = file_size(working);
    auto passProgress = oldSize - newSize;
    std::cerr << "|  after pass reduction: " << newSize << "\n";

    // always stop after a pass reduction attempt, for final cleanup
    if (stopping) {
      break;
    }

    // check if the full cycle (destructive/passes) has helped or not
    if (lastPostPassesSize && newSize >= lastPostPassesSize) {
      std::cerr << "|  progress has stopped, skipping to the end\n";
      if (factor == 1) {
        // this is after doing work with factor 1, so after the remaining work,
        // stop
        stopping = true;
      } else {
        // decrease the factor quickly
        factor = (factor + 1) / 2; // stable on 1
      }
    }
    lastPostPassesSize = newSize;

    // If destructive reductions lead to useful proportionate pass reductions,
    // keep going at the same factor, as pass reductions are far faster.
    std::cerr << "|  pass progress: " << passProgress
              << ", last destructive: " << lastDestructiveReductions << '\n';
    if (passProgress >= 4 * lastDestructiveReductions) {
      std::cerr << "|  progress is good, do not quickly decrease factor\n";
      // While the amount of pass reductions is proportionately high, we do
      // still want to reduce the factor by some amount. If we do not then there
      // is a risk that both pass and destructive reductions are very low, and
      // we get "stuck" cycling through them. In that case we simply need to do
      // more destructive reductions to make real progress. For that reason,
      // decrease the factor by some small percentage.
      factor = std::max(1, (factor * 9) / 10);
    } else {
      if (factor > 10) {
        factor = (factor / 3) + 1;
      } else {
        factor = (factor + 1) / 2; // stable on 1
      }
    }

    // no point in a factor lorger than the size
    assert(newSize > 4); // wasm modules are >4 bytes anyhow
    factor = std::min(factor, int(newSize) / 4);

    // try to reduce destructively. if a high factor fails to find anything,
    // quickly try a lower one (no point in doing passes until we reduce
    // destructively at least a little)
    while (1) {
      std::cerr << "|  reduce destructively... (factor: " << factor << ")\n";
      lastDestructiveReductions = reducer.reduceDestructively(factor);
      if (lastDestructiveReductions > 0) {
        break;
      }
      // we failed to reduce destructively
      if (factor == 1) {
        stopping = true;
        break;
      }
      factor = std::max(
        1, factor / 4); // quickly now, try to find *something* we can reduce
    }

    std::cerr << "|  destructive reduction led to size: " << file_size(working)
              << '\n';
  }
  std::cerr << "|finished, final size: " << file_size(working) << "\n";
  copy_file(working, test); // just to avoid confusion
}